

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int lookupName(Parse *pParse,char *zDb,char *zTab,char *zCol,NameContext *pNC,Expr *pExpr)

{
  byte *pbVar1;
  char cVar2;
  short sVar3;
  ushort uVar4;
  sqlite3 *psVar5;
  SrcList *pSVar6;
  Select *pSVar7;
  IdList *pIVar8;
  ExprList *pEList;
  ExprList_item *pEVar9;
  Db *pDVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  Table *pTVar18;
  u8 uVar19;
  ushort uVar20;
  int iVar21;
  ulong uVar22;
  Schema **ppSVar23;
  Table **ppTVar24;
  char *pcVar25;
  uint uVar26;
  uint uVar27;
  SrcList_item *pSVar28;
  NameContext *pNVar29;
  uint uVar30;
  long lVar31;
  char **ppcVar32;
  IdList_item *pIVar33;
  long lVar34;
  ulong uVar35;
  int iVar36;
  Column *pCVar37;
  int local_c0;
  SrcList_item *local_a0;
  Schema *local_90;
  
  psVar5 = pParse->db;
  pExpr->iTable = -1;
  pExpr->pTab = (Table *)0x0;
  iVar16 = 0;
  if ((zDb == (char *)0x0) || ((pNC->ncFlags & 6) != 0)) {
    local_90 = (Schema *)0x0;
    zDb = (char *)0x0;
  }
  else {
    iVar36 = psVar5->nDb;
    if ((long)iVar36 < 1) {
      local_90 = (Schema *)0x0;
    }
    else {
      pDVar10 = psVar5->aDb;
      local_90 = (Schema *)0x0;
      lVar31 = 0;
      do {
        iVar15 = sqlite3StrICmp(*(char **)((long)&pDVar10->zDbSName + lVar31),zDb);
        if (iVar15 == 0) {
          local_90 = *(Schema **)((long)&pDVar10->pSchema + lVar31);
          break;
        }
        lVar31 = lVar31 + 0x20;
      } while ((long)iVar36 * 0x20 != lVar31);
    }
  }
  local_a0 = (SrcList_item *)0x0;
  bVar12 = false;
  iVar36 = 0;
  local_c0 = 0;
  pNVar29 = pNC;
  do {
    if ((pNVar29 == (NameContext *)0x0) || (local_c0 != 0)) {
      if ((zTab == (char *)0x0) && ((local_c0 == 0 && ((pExpr->flags & 0x40) != 0)))) {
        pExpr->op = 'a';
        pExpr->pTab = (Table *)0x0;
        return 1;
      }
      if (local_c0 != 1) {
        pcVar25 = "ambiguous column name";
        if (local_c0 == 0) {
          pcVar25 = "no such column";
        }
        if (zDb == (char *)0x0) {
          if (zTab == (char *)0x0) {
            sqlite3ErrorMsg(pParse,"%s: %s",pcVar25,zCol);
          }
          else {
            sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar25,zTab,zCol);
          }
        }
        else {
          sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar25,zDb,zTab,zCol);
        }
        pParse->checkSchema = '\x01';
        pNC->nErr = pNC->nErr + 1;
      }
      uVar4 = pExpr->iColumn;
      if ((-1 < (short)uVar4) && (local_a0 != (SrcList_item *)0x0)) {
        uVar20 = 0x3f;
        if (uVar4 < 0x3f) {
          uVar20 = uVar4;
        }
        local_a0->colUsed = local_a0->colUsed | 1L << ((byte)uVar20 & 0x3f);
      }
      if (pExpr->pLeft != (Expr *)0x0) {
        sqlite3ExprDeleteNN(psVar5,pExpr->pLeft);
      }
      pExpr->pLeft = (Expr *)0x0;
      if (pExpr->pRight != (Expr *)0x0) {
        sqlite3ExprDeleteNN(psVar5,pExpr->pRight);
      }
      pExpr->pRight = (Expr *)0x0;
      uVar19 = 'X';
      if (!bVar12) {
        uVar19 = 0x98;
      }
      pExpr->op = uVar19;
      goto LAB_0015af56;
    }
    pSVar6 = pNVar29->pSrcList;
    if (pSVar6 == (SrcList *)0x0) {
      local_c0 = 0;
    }
    else {
      iVar15 = pSVar6->nSrc;
      if (iVar15 < 1) {
        local_c0 = 0;
      }
      else {
        pSVar28 = pSVar6->a;
        iVar21 = 0;
        local_c0 = 0;
        do {
          pTVar18 = pSVar28->pTab;
          pSVar7 = pSVar28->pSelect;
          if ((pSVar7 == (Select *)0x0) || ((pSVar7->selFlags & 0x800) == 0)) {
LAB_0015a898:
            if ((zDb == (char *)0x0) || (pTVar18->pSchema == local_90)) {
              if (zTab != (char *)0x0) {
                pcVar25 = pSVar28->zAlias;
                if (pcVar25 == (char *)0x0) {
                  pcVar25 = pTVar18->zName;
                }
                iVar13 = sqlite3StrICmp(pcVar25,zTab);
                if (iVar13 != 0) goto LAB_0015a9fb;
              }
              iVar13 = iVar36 + 1;
              if (iVar36 == 0) {
                local_a0 = pSVar28;
              }
              sVar3 = pTVar18->nCol;
              iVar36 = iVar13;
              if (0 < sVar3) {
                pCVar37 = pTVar18->aCol;
                iVar13 = 0;
                do {
                  iVar14 = sqlite3StrICmp(pCVar37->zName,zCol);
                  if (iVar14 == 0) {
                    if (local_c0 != 1) {
LAB_0015a9bf:
                      local_c0 = local_c0 + 1;
                      if (iVar13 == pTVar18->iPKey) {
                        iVar13 = 0xffff;
                      }
                      pExpr->iColumn = (ynVar)iVar13;
                      local_a0 = pSVar28;
                      break;
                    }
                    if (((pSVar28->fg).jointype & 4) == 0) {
                      pIVar8 = pSVar28->pUsing;
                      if ((pIVar8 == (IdList *)0x0) ||
                         (uVar22 = (ulong)pIVar8->nId, (long)uVar22 < 1)) goto LAB_0015a9bf;
                      pIVar33 = pIVar8->a;
                      iVar14 = sqlite3StrICmp(pIVar33->zName,zCol);
                      if (iVar14 != 0) {
                        uVar35 = 0;
                        do {
                          pIVar33 = pIVar33 + 1;
                          if (uVar22 - 1 == uVar35) goto LAB_0015a9bf;
                          iVar14 = sqlite3StrICmp(pIVar33->zName,zCol);
                          uVar35 = uVar35 + 1;
                        } while (iVar14 != 0);
                        if (uVar22 <= uVar35) goto LAB_0015a9bf;
                      }
                    }
                  }
                  iVar13 = iVar13 + 1;
                  pCVar37 = pCVar37 + 1;
                } while (iVar13 != sVar3);
              }
            }
          }
          else {
            lVar31 = (long)pSVar7->pEList->nExpr;
            bVar11 = false;
            if (0 < lVar31) {
              ppcVar32 = &pSVar7->pEList->a->zSpan;
              lVar34 = 0;
              do {
                iVar13 = sqlite3MatchSpanName(*ppcVar32,zCol,zTab,zDb);
                if (iVar13 != 0) {
                  local_c0 = local_c0 + 1;
                  pExpr->iColumn = (ynVar)lVar34;
                  bVar11 = true;
                  iVar36 = 2;
                  local_a0 = pSVar28;
                }
                lVar34 = lVar34 + 1;
                ppcVar32 = ppcVar32 + 4;
              } while (lVar31 != lVar34);
            }
            if (zTab != (char *)0x0 && !bVar11) goto LAB_0015a898;
          }
LAB_0015a9fb:
          iVar21 = iVar21 + 1;
          pSVar28 = pSVar28 + 1;
        } while (iVar21 != iVar15);
      }
      if (local_a0 == (SrcList_item *)0x0) {
        local_a0 = (SrcList_item *)0x0;
      }
      else {
        pExpr->iTable = local_a0->iCursor;
        pTVar18 = local_a0->pTab;
        pExpr->pTab = pTVar18;
        if (((local_a0->fg).jointype & 8) != 0) {
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 0x10;
        }
        local_90 = pTVar18->pSchema;
      }
    }
    if (iVar36 == 0 && (zTab != (char *)0x0 && zDb == (char *)0x0)) {
      pTVar18 = pParse->pTriggerTab;
      iVar36 = 0;
      if (pTVar18 != (Table *)0x0) {
        uVar19 = pParse->eTriggerOp;
        if (uVar19 == 'm') {
LAB_0015aab7:
          iVar21 = sqlite3StrICmp("old",zTab);
          iVar15 = 0;
          if (iVar21 != 0) goto LAB_0015aacc;
LAB_0015aadb:
          pExpr->iTable = iVar15;
        }
        else {
          iVar15 = sqlite3StrICmp("new",zTab);
          if (iVar15 == 0) {
            iVar15 = 1;
            goto LAB_0015aadb;
          }
          if (uVar19 != 'l') goto LAB_0015aab7;
LAB_0015aacc:
          pTVar18 = (Table *)0x0;
        }
        if (pTVar18 != (Table *)0x0) {
          local_90 = pTVar18->pSchema;
          uVar30 = (uint)pTVar18->nCol;
          if (pTVar18->nCol < 1) {
            uVar27 = 0;
          }
          else {
            pCVar37 = pTVar18->aCol;
            uVar26 = 0;
            do {
              iVar36 = sqlite3StrICmp(pCVar37->zName,zCol);
              if (iVar36 == 0) {
                uVar27 = uVar26;
                if ((int)pTVar18->iPKey == uVar26) {
                  uVar27 = 0xffffffff;
                }
                break;
              }
              uVar26 = uVar26 + 1;
              pCVar37 = pCVar37 + 1;
              uVar27 = uVar30;
            } while (uVar30 != uVar26);
          }
          if (((int)uVar30 <= (int)uVar27) && (iVar36 = sqlite3IsRowid(zCol), iVar36 != 0)) {
            uVar27 = uVar27 | -(uint)((pTVar18->tabFlags & 0x40) == 0);
          }
          iVar36 = 1;
          if ((int)uVar27 < (int)uVar30) {
            if ((int)uVar27 < 0) {
              pExpr->affinity = 'D';
            }
            else {
              uVar30 = 1 << ((byte)uVar27 & 0x1f);
              if (0x1f < (int)uVar27) {
                uVar30 = 0xffffffff;
              }
              if (pExpr->iTable == 0) {
                pParse->oldmask = pParse->oldmask | uVar30;
              }
              else {
                pParse->newmask = pParse->newmask | uVar30;
              }
            }
            local_c0 = local_c0 + 1;
            pExpr->iColumn = (ynVar)uVar27;
            pExpr->pTab = pTVar18;
            bVar12 = true;
          }
        }
      }
    }
    if (((((local_c0 == 0) && (iVar36 == 1)) && (local_a0 != (SrcList_item *)0x0)) &&
        ((local_c0 = 0, (pNVar29->ncFlags & 0x20) == 0 &&
         (iVar15 = sqlite3IsRowid(zCol), iVar15 != 0)))) && ((local_a0->pTab->tabFlags & 0x40) == 0)
       ) {
      pExpr->iColumn = -1;
      pExpr->affinity = 'D';
      local_c0 = 1;
    }
    if (((local_c0 == 0) && (zTab == (char *)0x0)) &&
       (pEList = pNVar29->pEList, pEList != (ExprList *)0x0)) {
      if (pEList->nExpr < 1) {
        local_c0 = 0;
      }
      else {
        lVar31 = 0;
        lVar34 = 8;
        local_c0 = 0;
        do {
          pEVar9 = pEList->a;
          pcVar25 = *(char **)((long)&pEVar9->pExpr + lVar34);
          bVar11 = true;
          if ((pcVar25 == (char *)0x0) || (iVar15 = sqlite3StrICmp(pcVar25,zCol), iVar15 != 0)) {
            iVar15 = 0;
          }
          else {
            pcVar17 = *(char **)((long)pEVar9 + lVar34 + -8);
            if (((pNVar29->ncFlags & 1) == 0) && ((pcVar17[4] & 2U) != 0)) {
              sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar25);
LAB_0015ad4d:
              bVar11 = false;
              iVar15 = 1;
            }
            else {
              cVar2 = *pcVar17;
              if (cVar2 == -99) {
                cVar2 = pcVar17[0x36];
              }
              if (cVar2 == 'w') {
                pcVar17 = *(char **)(pcVar17 + 0x20);
LAB_0015acd6:
                if (**(int **)pcVar17 != 1) {
                  sqlite3ErrorMsg(pParse,"row value misused");
                  goto LAB_0015ad4d;
                }
              }
              else if (cVar2 == -0x62) {
                pcVar17 = pcVar17 + 0x20;
                goto LAB_0015acd6;
              }
              resolveAlias(pParse,pEList,(int)lVar31,pExpr,"",iVar16);
              local_c0 = 1;
              iVar15 = 0x16;
              local_a0 = (SrcList_item *)0x0;
              bVar11 = false;
            }
          }
          if (!bVar11) goto LAB_0015ad84;
          lVar31 = lVar31 + 1;
          lVar34 = lVar34 + 0x20;
        } while (lVar31 < pEList->nExpr);
      }
    }
    iVar15 = 0;
    if (local_c0 == 0) {
      pNVar29 = pNVar29->pNext;
      iVar16 = iVar16 + 1;
      iVar15 = 0;
    }
LAB_0015ad84:
  } while (iVar15 == 0);
  if (iVar15 == 0x16) {
LAB_0015af56:
    iVar16 = 2;
    if (local_c0 == 1) {
      if (((pExpr->flags & 0x400000) == 0) &&
         (psVar5 = pParse->db, psVar5->xAuth != (sqlite3_xauth)0x0)) {
        if (local_90 == (Schema *)0x0) {
          uVar22 = 0xfff0bdc0;
        }
        else {
          uVar30 = psVar5->nDb;
          if ((int)uVar30 < 1) {
            uVar22 = 0;
          }
          else {
            ppSVar23 = &psVar5->aDb->pSchema;
            uVar22 = 0;
            do {
              if (*ppSVar23 == local_90) goto LAB_0015afc2;
              uVar22 = uVar22 + 1;
              ppSVar23 = ppSVar23 + 4;
            } while (uVar30 != uVar22);
            uVar22 = (ulong)uVar30;
          }
        }
LAB_0015afc2:
        if (-1 < (int)uVar22) {
          if (pExpr->op == 'X') {
            ppTVar24 = &pParse->pTriggerTab;
LAB_0015afd8:
            pTVar18 = *ppTVar24;
          }
          else {
            lVar31 = (long)pNVar29->pSrcList->nSrc;
            if (lVar31 < 1) {
              pTVar18 = (Table *)0x0;
            }
            else {
              ppTVar24 = &pNVar29->pSrcList->a[0].pTab;
              pTVar18 = (Table *)0x0;
              do {
                if (pExpr->iTable == *(int *)((long)ppTVar24 + 0x24)) goto LAB_0015afd8;
                ppTVar24 = ppTVar24 + 0xe;
                lVar31 = lVar31 + -1;
              } while (lVar31 != 0);
            }
          }
          if (pTVar18 != (Table *)0x0) {
            lVar31 = (long)pExpr->iColumn;
            if ((pExpr->iColumn < 0) && (lVar31 = (long)pTVar18->iPKey, lVar31 < 0)) {
              pcVar25 = "ROWID";
            }
            else {
              pcVar25 = pTVar18->aCol[lVar31].zName;
            }
            iVar16 = sqlite3AuthReadCol(pParse,pTVar18->zName,pcVar25,(int)uVar22);
            if (iVar16 == 2) {
              pExpr->op = 'e';
            }
          }
        }
      }
      pNC->nRef = pNC->nRef + 1;
      iVar16 = 1;
      if (pNVar29 != pNC) {
        do {
          pNC = pNC->pNext;
          pNC->nRef = pNC->nRef + 1;
        } while (pNC != pNVar29);
      }
    }
  }
  else {
    iVar16 = 2;
  }
  return iVar16;
}

Assistant:

static int lookupName(
  Parse *pParse,       /* The parsing context */
  const char *zDb,     /* Name of the database containing table, or NULL */
  const char *zTab,    /* Name of table containing column, or NULL */
  const char *zCol,    /* Name of the column. */
  NameContext *pNC,    /* The name context used to resolve the name */
  Expr *pExpr          /* Make this EXPR node point to the selected column */
){
  int i, j;                         /* Loop counters */
  int cnt = 0;                      /* Number of matching column names */
  int cntTab = 0;                   /* Number of matching table names */
  int nSubquery = 0;                /* How many levels of subquery */
  sqlite3 *db = pParse->db;         /* The database connection */
  struct SrcList_item *pItem;       /* Use for looping over pSrcList items */
  struct SrcList_item *pMatch = 0;  /* The matching pSrcList item */
  NameContext *pTopNC = pNC;        /* First namecontext in the list */
  Schema *pSchema = 0;              /* Schema of the expression */
  int isTrigger = 0;                /* True if resolved to a trigger column */
  Table *pTab = 0;                  /* Table hold the row */
  Column *pCol;                     /* A column of pTab */

  assert( pNC );     /* the name context cannot be NULL. */
  assert( zCol );    /* The Z in X.Y.Z cannot be NULL */
  assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );

  /* Initialize the node to no-match */
  pExpr->iTable = -1;
  pExpr->pTab = 0;
  ExprSetVVAProperty(pExpr, EP_NoReduce);

  /* Translate the schema name in zDb into a pointer to the corresponding
  ** schema.  If not found, pSchema will remain NULL and nothing will match
  ** resulting in an appropriate error message toward the end of this routine
  */
  if( zDb ){
    testcase( pNC->ncFlags & NC_PartIdx );
    testcase( pNC->ncFlags & NC_IsCheck );
    if( (pNC->ncFlags & (NC_PartIdx|NC_IsCheck))!=0 ){
      /* Silently ignore database qualifiers inside CHECK constraints and
      ** partial indices.  Do not raise errors because that might break
      ** legacy and because it does not hurt anything to just ignore the
      ** database name. */
      zDb = 0;
    }else{
      for(i=0; i<db->nDb; i++){
        assert( db->aDb[i].zDbSName );
        if( sqlite3StrICmp(db->aDb[i].zDbSName,zDb)==0 ){
          pSchema = db->aDb[i].pSchema;
          break;
        }
      }
    }
  }

  /* Start at the inner-most context and move outward until a match is found */
  while( pNC && cnt==0 ){
    ExprList *pEList;
    SrcList *pSrcList = pNC->pSrcList;

    if( pSrcList ){
      for(i=0, pItem=pSrcList->a; i<pSrcList->nSrc; i++, pItem++){
        pTab = pItem->pTab;
        assert( pTab!=0 && pTab->zName!=0 );
        assert( pTab->nCol>0 );
        if( pItem->pSelect && (pItem->pSelect->selFlags & SF_NestedFrom)!=0 ){
          int hit = 0;
          pEList = pItem->pSelect->pEList;
          for(j=0; j<pEList->nExpr; j++){
            if( sqlite3MatchSpanName(pEList->a[j].zSpan, zCol, zTab, zDb) ){
              cnt++;
              cntTab = 2;
              pMatch = pItem;
              pExpr->iColumn = j;
              hit = 1;
            }
          }
          if( hit || zTab==0 ) continue;
        }
        if( zDb && pTab->pSchema!=pSchema ){
          continue;
        }
        if( zTab ){
          const char *zTabName = pItem->zAlias ? pItem->zAlias : pTab->zName;
          assert( zTabName!=0 );
          if( sqlite3StrICmp(zTabName, zTab)!=0 ){
            continue;
          }
        }
        if( 0==(cntTab++) ){
          pMatch = pItem;
        }
        for(j=0, pCol=pTab->aCol; j<pTab->nCol; j++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            /* If there has been exactly one prior match and this match
            ** is for the right-hand table of a NATURAL JOIN or is in a 
            ** USING clause, then skip this match.
            */
            if( cnt==1 ){
              if( pItem->fg.jointype & JT_NATURAL ) continue;
              if( nameInUsingClause(pItem->pUsing, zCol) ) continue;
            }
            cnt++;
            pMatch = pItem;
            /* Substitute the rowid (column -1) for the INTEGER PRIMARY KEY */
            pExpr->iColumn = j==pTab->iPKey ? -1 : (i16)j;
            break;
          }
        }
      }
      if( pMatch ){
        pExpr->iTable = pMatch->iCursor;
        pExpr->pTab = pMatch->pTab;
        /* RIGHT JOIN not (yet) supported */
        assert( (pMatch->fg.jointype & JT_RIGHT)==0 );
        if( (pMatch->fg.jointype & JT_LEFT)!=0 ){
          ExprSetProperty(pExpr, EP_CanBeNull);
        }
        pSchema = pExpr->pTab->pSchema;
      }
    } /* if( pSrcList ) */

#ifndef SQLITE_OMIT_TRIGGER
    /* If we have not already resolved the name, then maybe 
    ** it is a new.* or old.* trigger argument reference
    */
    if( zDb==0 && zTab!=0 && cntTab==0 && pParse->pTriggerTab!=0 ){
      int op = pParse->eTriggerOp;
      assert( op==TK_DELETE || op==TK_UPDATE || op==TK_INSERT );
      if( op!=TK_DELETE && sqlite3StrICmp("new",zTab) == 0 ){
        pExpr->iTable = 1;
        pTab = pParse->pTriggerTab;
      }else if( op!=TK_INSERT && sqlite3StrICmp("old",zTab)==0 ){
        pExpr->iTable = 0;
        pTab = pParse->pTriggerTab;
      }else{
        pTab = 0;
      }

      if( pTab ){ 
        int iCol;
        pSchema = pTab->pSchema;
        cntTab++;
        for(iCol=0, pCol=pTab->aCol; iCol<pTab->nCol; iCol++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            if( iCol==pTab->iPKey ){
              iCol = -1;
            }
            break;
          }
        }
        if( iCol>=pTab->nCol && sqlite3IsRowid(zCol) && VisibleRowid(pTab) ){
          /* IMP: R-51414-32910 */
          iCol = -1;
        }
        if( iCol<pTab->nCol ){
          cnt++;
          if( iCol<0 ){
            pExpr->affinity = SQLITE_AFF_INTEGER;
          }else if( pExpr->iTable==0 ){
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->oldmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }else{
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->newmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }
          pExpr->iColumn = (i16)iCol;
          pExpr->pTab = pTab;
          isTrigger = 1;
        }
      }
    }
#endif /* !defined(SQLITE_OMIT_TRIGGER) */

    /*
    ** Perhaps the name is a reference to the ROWID
    */
    if( cnt==0
     && cntTab==1
     && pMatch
     && (pNC->ncFlags & NC_IdxExpr)==0
     && sqlite3IsRowid(zCol)
     && VisibleRowid(pMatch->pTab)
    ){
      cnt = 1;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }

    /*
    ** If the input is of the form Z (not Y.Z or X.Y.Z) then the name Z
    ** might refer to an result-set alias.  This happens, for example, when
    ** we are resolving names in the WHERE clause of the following command:
    **
    **     SELECT a+b AS x FROM table WHERE x<10;
    **
    ** In cases like this, replace pExpr with a copy of the expression that
    ** forms the result set entry ("a+b" in the example) and return immediately.
    ** Note that the expression in the result set should have already been
    ** resolved by the time the WHERE clause is resolved.
    **
    ** The ability to use an output result-set column in the WHERE, GROUP BY,
    ** or HAVING clauses, or as part of a larger expression in the ORDER BY
    ** clause is not standard SQL.  This is a (goofy) SQLite extension, that
    ** is supported for backwards compatibility only. Hence, we issue a warning
    ** on sqlite3_log() whenever the capability is used.
    */
    if( (pEList = pNC->pEList)!=0
     && zTab==0
     && cnt==0
    ){
      for(j=0; j<pEList->nExpr; j++){
        char *zAs = pEList->a[j].zName;
        if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
          Expr *pOrig;
          assert( pExpr->pLeft==0 && pExpr->pRight==0 );
          assert( pExpr->x.pList==0 );
          assert( pExpr->x.pSelect==0 );
          pOrig = pEList->a[j].pExpr;
          if( (pNC->ncFlags&NC_AllowAgg)==0 && ExprHasProperty(pOrig, EP_Agg) ){
            sqlite3ErrorMsg(pParse, "misuse of aliased aggregate %s", zAs);
            return WRC_Abort;
          }
          if( sqlite3ExprVectorSize(pOrig)!=1 ){
            sqlite3ErrorMsg(pParse, "row value misused");
            return WRC_Abort;
          }
          resolveAlias(pParse, pEList, j, pExpr, "", nSubquery);
          cnt = 1;
          pMatch = 0;
          assert( zTab==0 && zDb==0 );
          goto lookupname_end;
        }
      } 
    }

    /* Advance to the next name context.  The loop will exit when either
    ** we have a match (cnt>0) or when we run out of name contexts.
    */
    if( cnt==0 ){
      pNC = pNC->pNext;
      nSubquery++;
    }
  }

  /*
  ** If X and Y are NULL (in other words if only the column name Z is
  ** supplied) and the value of Z is enclosed in double-quotes, then
  ** Z is a string literal if it doesn't match any column names.  In that
  ** case, we need to return right away and not make any changes to
  ** pExpr.
  **
  ** Because no reference was made to outer contexts, the pNC->nRef
  ** fields are not changed in any context.
  */
  if( cnt==0 && zTab==0 && ExprHasProperty(pExpr,EP_DblQuoted) ){
    pExpr->op = TK_STRING;
    pExpr->pTab = 0;
    return WRC_Prune;
  }

  /*
  ** cnt==0 means there was not match.  cnt>1 means there were two or
  ** more matches.  Either way, we have an error.
  */
  if( cnt!=1 ){
    const char *zErr;
    zErr = cnt==0 ? "no such column" : "ambiguous column name";
    if( zDb ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s.%s", zErr, zDb, zTab, zCol);
    }else if( zTab ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zErr, zTab, zCol);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zErr, zCol);
    }
    pParse->checkSchema = 1;
    pTopNC->nErr++;
  }

  /* If a column from a table in pSrcList is referenced, then record
  ** this fact in the pSrcList.a[].colUsed bitmask.  Column 0 causes
  ** bit 0 to be set.  Column 1 sets bit 1.  And so forth.  If the
  ** column number is greater than the number of bits in the bitmask
  ** then set the high-order bit of the bitmask.
  */
  if( pExpr->iColumn>=0 && pMatch!=0 ){
    int n = pExpr->iColumn;
    testcase( n==BMS-1 );
    if( n>=BMS ){
      n = BMS-1;
    }
    assert( pMatch->iCursor==pExpr->iTable );
    pMatch->colUsed |= ((Bitmask)1)<<n;
  }

  /* Clean up and return
  */
  sqlite3ExprDelete(db, pExpr->pLeft);
  pExpr->pLeft = 0;
  sqlite3ExprDelete(db, pExpr->pRight);
  pExpr->pRight = 0;
  pExpr->op = (isTrigger ? TK_TRIGGER : TK_COLUMN);
lookupname_end:
  if( cnt==1 ){
    assert( pNC!=0 );
    if( !ExprHasProperty(pExpr, EP_Alias) ){
      sqlite3AuthRead(pParse, pExpr, pSchema, pNC->pSrcList);
    }
    /* Increment the nRef value on all name contexts from TopNC up to
    ** the point where the name matched. */
    for(;;){
      assert( pTopNC!=0 );
      pTopNC->nRef++;
      if( pTopNC==pNC ) break;
      pTopNC = pTopNC->pNext;
    }
    return WRC_Prune;
  } else {
    return WRC_Abort;
  }
}